

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ConvertMesh
          (BlenderImporter *this,Scene *param_1,Object *param_2,Mesh *mesh,ConversionData *conv_data
          ,TempArray<std::vector,_aiMesh> *temp)

{
  size_t *this_00;
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ObjectSet *pOVar5;
  ConversionData *pCVar6;
  TempArray<std::vector,_aiMesh> *pTVar7;
  bool bVar8;
  uint uVar9;
  size_type sVar10;
  mapped_type_conflict3 *pmVar11;
  mywrap *pmVar12;
  mywrap *this_01;
  size_type sVar13;
  aiMesh *this_02;
  reference ppaVar14;
  ulong uVar15;
  ulong *puVar16;
  difference_type dVar17;
  aiMesh **ppaVar18;
  void *pvVar19;
  const_reference pvVar20;
  element_type *peVar21;
  element_type *peVar22;
  ElemBase *pEVar23;
  size_type sVar24;
  ulong uVar25;
  pointer ppVar26;
  mapped_type *ppMVar27;
  aiVector3D *paVar28;
  reference ppaVar29;
  aiColor4D *paVar30;
  const_reference pvVar31;
  const_reference pvVar32;
  aiFace *paVar33;
  ulong uVar34;
  pair<unsigned_int,_const_Assimp::Blender::MLoopUV_*> pVar35;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_const_MLoopUV_*>_>::value,_pair<iterator,_bool>_>
  _Var36;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_map<unsigned_int,_const_MLoopUV_*>_>_>::value,_pair<iterator,_bool>_>
  _Var37;
  aiColor4t<float> *local_f58;
  aiVector3t<float> *local_ef0;
  aiVector3t<float> *local_e50;
  aiVector3t<float> *local_e20;
  MLoopUV *local_db0;
  aiFace *local_cb0;
  aiVector3t<float> *local_c80;
  aiVector3t<float> *local_c50;
  MLoopCol *col_1;
  uint j_3;
  ai_real scaleZeroToOne;
  aiColor4D *vo_7;
  aiFace *f_6;
  aiMesh *local_b58;
  aiMesh *out_7;
  MPoly *v_5;
  int i_11;
  uint n_1;
  MCol *col;
  aiColor4D *paStack_b30;
  uint n;
  aiColor4D *vo_6;
  aiFace *f_5;
  aiMesh *local_b18;
  aiMesh *out_6;
  iterator iStack_b08;
  int i_10;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_b00;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_af8;
  iterator it_3;
  string local_ae8;
  uint local_ac4;
  aiVector3D *paStack_ac0;
  uint i_9;
  aiVector3D *vo_5;
  aiFace *f_4;
  aiMesh *local_aa8;
  aiMesh *out_5;
  TFace *v_4;
  iterator iStack_a90;
  int i_8;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_a88;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_a80;
  iterator it_2;
  string local_a70;
  mapped_type local_a50;
  MLoopUV *uv_1;
  aiVector3D *paStack_a40;
  uint32_t j_2;
  aiVector3D *vo_4;
  MLoopUV *tm;
  const_reference pvStack_a28;
  uint32_t m_1;
  MLoopUV *uv;
  aiVector3D *paStack_a18;
  uint j_1;
  aiVector3D *vo_3;
  key_type local_a04;
  _Self local_a00;
  iterator itMatTexUvMapping_1;
  aiFace *f_3;
  aiMesh *local_9e8;
  aiMesh *out_4;
  MPoly *v_3;
  int i_7;
  uint i_6;
  aiVector3D *vo_2;
  aiFace *f_2;
  aiMesh *local_9b8;
  aiMesh *out_3;
  MTFace *v_2;
  int i_5;
  uint32_t i_4;
  _Self local_998;
  iterator itMatTexUvMapping;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_988;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_980;
  iterator it_1;
  string local_970;
  _Base_ptr local_950;
  undefined1 local_948;
  pair<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>
  local_940;
  _Base_ptr local_908;
  undefined1 local_900;
  MLoopUV *local_8f8;
  pair<unsigned_int,_const_Assimp::Blender::MLoopUV_*> local_8f0;
  allocator<char> local_8d9;
  string local_8d8;
  ElemBase *local_8b8;
  ElemBase *pLoop;
  uint32_t t;
  uint32_t maxTex;
  TextureUVMapping texuv;
  shared_ptr<Assimp::Blender::Material> pMat;
  uint32_t m;
  uint32_t maxMat;
  MaterialTextureUVMappings matTexUvMappings;
  MVert *v_1;
  string local_820;
  const_reference local_800;
  MLoop *loop;
  aiVector3D *paStack_7f0;
  int j;
  aiVector3D *vn_1;
  aiVector3D *vo_1;
  aiFace *f_1;
  aiMesh *local_7d0;
  aiMesh *out_2;
  MPoly *mf_2;
  int i_3;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  const_reference local_748;
  MVert *v;
  string local_738;
  aiVector3D *local_718;
  aiVector3D *vn;
  aiVector3D *vo;
  aiFace *f;
  aiMesh *local_6f8;
  aiMesh *out_1;
  MFace *mf_1;
  undefined1 local_6e0 [4];
  int i_2;
  iterator local_6c0;
  iterator local_6a0;
  iterator local_680;
  iterator local_660;
  undefined1 local_640 [8];
  iterator has;
  shared_ptr<Assimp::Blender::Material> mat;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  aiString local_5bc;
  value_type local_1b8;
  aiMesh *out;
  key_type_conflict local_1a8;
  reference local_1a0;
  MyPair *it;
  iterator __end1;
  iterator __begin1;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  *__range1;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  mat_num_to_mesh_idx;
  size_t old;
  const_reference local_140;
  MPoly *mp;
  const_reference pvStack_130;
  int i_1;
  MFace *mf;
  undefined1 local_120 [4];
  int i;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat_verts;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  per_mat;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  TempArray<std::vector,_aiMesh> *local_38;
  TempArray<std::vector,_aiMesh> *temp_local;
  ConversionData *conv_data_local;
  Mesh *mesh_local;
  Object *param_2_local;
  Scene *param_1_local;
  BlenderImporter *this_local;
  
  if (((mesh->totface != 0) || (mesh->totloop != 0)) && (mesh->totvert != 0)) {
    iVar1 = mesh->totface;
    local_38 = temp;
    temp_local = (TempArray<std::vector,_aiMesh> *)conv_data;
    conv_data_local = (ConversionData *)mesh;
    mesh_local = (Mesh *)param_2;
    param_2_local = (Object *)param_1;
    param_1_local = (Scene *)this;
    sVar10 = std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::size
                       (&(mesh->mface).
                         super_vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                       );
    if (sVar10 < (ulong)(long)iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Number of faces is larger than the corresponding array",
                 &local_59);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    iVar1 = *(int *)&conv_data_local[3].meshes.arr.
                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    sVar10 = std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::size
                       ((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_> *)
                        &conv_data_local[3].textures.arr.
                         super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    if (sVar10 < (ulong)(long)iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Number of vertices is larger than the corresponding array",
                 &local_91);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
    }
    iVar1 = *(int *)((long)&conv_data_local[3].meshes.arr.
                            super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
    sVar10 = std::vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>::size
                       ((vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_> *)
                        &conv_data_local[3].materials_raw.
                         super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node);
    if (sVar10 < (ulong)(long)iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Number of vertices is larger than the corresponding array",
                 (allocator<char> *)
                 ((long)&per_mat._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&per_mat._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    }
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         *)&per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         *)local_120);
    for (mf._4_4_ = 0;
        mf._4_4_ <
        *(int *)&conv_data_local[3].meshes.arr.
                 super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish; mf._4_4_ = mf._4_4_ + 1) {
      pvStack_130 = std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::
                    operator[]((vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                                *)&conv_data_local[3].cameras.arr.
                                   super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,(long)mf._4_4_)
      ;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)&per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &pvStack_130->mat_nr);
      *pmVar11 = *pmVar11 + 1;
      iVar1 = pvStack_130->v4;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_120,&pvStack_130->mat_nr);
      *pmVar11 = (4 - (ulong)(iVar1 == 0)) + *pmVar11;
    }
    for (mp._4_4_ = 0;
        mp._4_4_ <
        *(int *)&conv_data_local[3].cameras.arr.
                 super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                 super__Vector_impl_data._M_start; mp._4_4_ = mp._4_4_ + 1) {
      local_140 = std::vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>::
                  operator[]((vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                              *)(conv_data_local[3].next_texture + 7),(long)mp._4_4_);
      old._4_4_ = (int)local_140->mat_nr;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)&per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type_conflict2 *)((long)&old + 4));
      *pmVar11 = *pmVar11 + 1;
      iVar1 = local_140->totloop;
      old._0_4_ = (int)local_140->mat_nr;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_120,(key_type_conflict2 *)&old);
      *pmVar11 = (long)iVar1 + *pmVar11;
    }
    pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
    mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar12);
    pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
    this_01 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
    sVar10 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(this_01);
    sVar13 = std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::size((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                     *)&per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(pmVar12,sVar10 + sVar13);
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *)&__range1);
    this_00 = &per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1 = std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::begin((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                      *)this_00);
    it = (MyPair *)
         std::
         map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         ::end((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                *)this_00);
    while (bVar8 = std::operator!=(&__end1,(_Self *)&it), bVar8) {
      local_1a0 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator*(&__end1);
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      sVar10 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pmVar12);
      local_1a8 = (key_type_conflict)local_1a0->first;
      pmVar11 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&__range1,&local_1a8);
      *pmVar11 = sVar10;
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      this_02 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_02);
      out = this_02;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(pmVar12,&out);
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::back(pmVar12);
      local_1b8 = *ppaVar14;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_120,&local_1a0->first);
      uVar25 = *pmVar11;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar25;
      uVar15 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      paVar28 = (aiVector3D *)operator_new__(uVar15);
      if (uVar25 != 0) {
        local_c50 = paVar28;
        do {
          aiVector3t<float>::aiVector3t(local_c50);
          local_c50 = local_c50 + 1;
        } while (local_c50 != paVar28 + uVar25);
      }
      local_1b8->mVertices = paVar28;
      pmVar11 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)local_120,&local_1a0->first);
      uVar25 = *pmVar11;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar25;
      uVar15 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      paVar28 = (aiVector3D *)operator_new__(uVar15);
      if (uVar25 != 0) {
        local_c80 = paVar28;
        do {
          aiVector3t<float>::aiVector3t(local_c80);
          local_c80 = local_c80 + 1;
        } while (local_c80 != paVar28 + uVar25);
      }
      local_1b8->mNormals = paVar28;
      uVar25 = local_1a0->second;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar25;
      uVar15 = SUB168(auVar4 * ZEXT816(0x10),0);
      uVar34 = uVar15 + 8;
      if (0xfffffffffffffff7 < uVar15) {
        uVar34 = 0xffffffffffffffff;
      }
      if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
        uVar34 = 0xffffffffffffffff;
      }
      puVar16 = (ulong *)operator_new__(uVar34);
      *puVar16 = uVar25;
      paVar33 = (aiFace *)(puVar16 + 1);
      if (uVar25 != 0) {
        local_cb0 = paVar33;
        do {
          aiFace::aiFace(local_cb0);
          local_cb0 = local_cb0 + 1;
        } while (local_cb0 != paVar33 + uVar25);
      }
      local_1b8->mFaces = paVar33;
      pOVar5 = &conv_data_local->objects;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,
                 (char *)((long)&(pOVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right + 2
                         ),&local_5e1);
      aiString::aiString(&local_5bc,&local_5e0);
      aiString::operator=(&local_1b8->mName,&local_5bc);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator(&local_5e1);
      bVar8 = Blender::vector::operator_cast_to_bool
                        ((vector *)
                         &conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      if (bVar8) {
        iVar1 = local_1a0->first;
        sVar10 = std::
                 vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 ::size((vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                         *)&conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        if (sVar10 <= (ulong)(long)iVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_608,"Material index is out of range",
                     (allocator<char> *)
                     ((long)&mat.
                             super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_608);
          std::__cxx11::string::~string((string *)&local_608);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&mat.
                             super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
        }
        pvVar20 = std::
                  vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                  ::operator[]((vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                *)&conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count,(long)local_1a0->first);
        std::shared_ptr<Assimp::Blender::Material>::shared_ptr
                  ((shared_ptr<Assimp::Blender::Material> *)&has._M_node,pvVar20);
        std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::begin(&local_660,
                (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                 *)(temp_local + 7));
        std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::end(&local_680,
              (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               *)(temp_local + 7));
        std::
        find<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>,std::shared_ptr<Assimp::Blender::Material>>
                  ((_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                    *)local_640,&local_660,&local_680,
                   (shared_ptr<Assimp::Blender::Material> *)&has._M_node);
        std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::end(&local_6a0,
              (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
               *)(temp_local + 7));
        bVar8 = std::operator!=((_Self *)local_640,&local_6a0);
        if (bVar8) {
          std::
          deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
          ::begin(&local_6c0,
                  (deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   *)(temp_local + 7));
          std::
          _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
          ::_Deque_iterator((_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                             *)local_6e0,
                            (_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                             *)local_640);
          dVar17 = std::
                   distance<std::_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,std::shared_ptr<Assimp::Blender::Material>&,std::shared_ptr<Assimp::Blender::Material>*>>
                             (&local_6c0,
                              (_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                               *)local_6e0);
          local_1b8->mMaterialIndex = (uint)dVar17;
        }
        else {
          sVar10 = std::
                   deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                   ::size((deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                           *)(temp_local + 7));
          local_1b8->mMaterialIndex = (uint)sVar10;
          std::
          deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
          ::push_back((deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                       *)(temp_local + 7),(value_type *)&has._M_node);
        }
        std::shared_ptr<Assimp::Blender::Material>::~shared_ptr
                  ((shared_ptr<Assimp::Blender::Material> *)&has._M_node);
      }
      else {
        local_1b8->mMaterialIndex = 0xffffffff;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator++(&__end1);
    }
    for (mf_1._4_4_ = 0;
        mf_1._4_4_ <
        *(int *)&conv_data_local[3].meshes.arr.
                 super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish; mf_1._4_4_ = mf_1._4_4_ + 1) {
      out_1 = (aiMesh *)
              std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::
              operator[]((vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_> *)
                         &conv_data_local[3].cameras.arr.
                          super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)mf_1._4_4_);
      pTVar7 = local_38;
      f = (aiFace *)(long)*(int *)&out_1->mTangents;
      pmVar11 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&__range1,(key_type_conflict *)&f);
      ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
      local_6f8 = *ppaVar18;
      uVar9 = local_6f8->mNumFaces;
      local_6f8->mNumFaces = uVar9 + 1;
      vo = (aiVector3D *)(local_6f8->mFaces + uVar9);
      uVar9 = 4 - (*(int *)((long)&out_1->mNormals + 4) == 0);
      ((aiFace *)vo)->mNumIndices = uVar9;
      pvVar19 = operator_new__((ulong)(uVar9 * 4));
      *(void **)&vo->z = pvVar19;
      vn = local_6f8->mVertices + local_6f8->mNumVertices;
      local_718 = local_6f8->mNormals + local_6f8->mNumVertices;
      if (*(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <= *(int *)&out_1->mVertices) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_738,"Vertex index v1 out of range",
                   (allocator<char> *)((long)&v + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_738);
        std::__cxx11::string::~string((string *)&local_738);
        std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
      }
      local_748 = std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::
                  operator[]((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                              *)&conv_data_local[3].textures.arr.
                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)*(int *)&out_1->mVertices);
      vn->x = local_748->co[0];
      vn->y = local_748->co[1];
      vn->z = local_748->co[2];
      local_718->x = local_748->no[0];
      local_718->y = local_748->no[1];
      local_718->z = local_748->no[2];
      uVar9 = local_6f8->mNumVertices;
      local_6f8->mNumVertices = uVar9 + 1;
      **(uint **)&vo->z = uVar9;
      vn = vn + 1;
      local_718 = local_718 + 1;
      if (*(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <=
          *(int *)((long)&out_1->mVertices + 4)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_768,"Vertex index v2 out of range",&local_769);
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_768);
        std::__cxx11::string::~string((string *)&local_768);
        std::allocator<char>::~allocator(&local_769);
      }
      local_748 = std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::
                  operator[]((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                              *)&conv_data_local[3].textures.arr.
                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)*(int *)((long)&out_1->mVertices + 4));
      vn->x = local_748->co[0];
      vn->y = local_748->co[1];
      vn->z = local_748->co[2];
      local_718->x = local_748->no[0];
      local_718->y = local_748->no[1];
      local_718->z = local_748->no[2];
      uVar9 = local_6f8->mNumVertices;
      local_6f8->mNumVertices = uVar9 + 1;
      *(uint *)(*(long *)&vo->z + 4) = uVar9;
      vn = vn + 1;
      local_718 = local_718 + 1;
      if (*(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <= *(int *)&out_1->mNormals) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_790,"Vertex index v3 out of range",&local_791);
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_790);
        std::__cxx11::string::~string((string *)&local_790);
        std::allocator<char>::~allocator(&local_791);
      }
      local_748 = std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::
                  operator[]((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                              *)&conv_data_local[3].textures.arr.
                                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)*(int *)&out_1->mNormals);
      vn->x = local_748->co[0];
      vn->y = local_748->co[1];
      vn->z = local_748->co[2];
      local_718->x = local_748->no[0];
      local_718->y = local_748->no[1];
      local_718->z = local_748->no[2];
      uVar9 = local_6f8->mNumVertices;
      local_6f8->mNumVertices = uVar9 + 1;
      *(uint *)(*(long *)&vo->z + 8) = uVar9;
      vn = vn + 1;
      local_718 = local_718 + 1;
      if (*(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <= *(int *)((long)&out_1->mNormals + 4)
         ) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i_3,"Vertex index v4 out of range",
                   (allocator<char> *)((long)&mf_2 + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)&i_3);
        std::__cxx11::string::~string((string *)&i_3);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mf_2 + 7));
      }
      if (*(int *)((long)&out_1->mNormals + 4) == 0) {
        local_6f8->mPrimitiveTypes = local_6f8->mPrimitiveTypes | 4;
      }
      else {
        local_748 = std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::
                    operator[]((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                                *)&conv_data_local[3].textures.arr.
                                   super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)*(int *)((long)&out_1->mNormals + 4));
        vn->x = local_748->co[0];
        vn->y = local_748->co[1];
        vn->z = local_748->co[2];
        local_718->x = local_748->no[0];
        local_718->y = local_748->no[1];
        local_718->z = local_748->no[2];
        uVar9 = local_6f8->mNumVertices;
        local_6f8->mNumVertices = uVar9 + 1;
        *(uint *)(*(long *)&vo->z + 0xc) = uVar9;
        vn = vn + 1;
        local_718 = local_718 + 1;
        local_6f8->mPrimitiveTypes = local_6f8->mPrimitiveTypes | 8;
      }
    }
    for (mf_2._0_4_ = 0;
        (int)mf_2 <
        *(int *)&conv_data_local[3].cameras.arr.
                 super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                 super__Vector_impl_data._M_start; mf_2._0_4_ = (int)mf_2 + 1) {
      out_2 = (aiMesh *)
              std::vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>::
              operator[]((vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_> *)
                         (conv_data_local[3].next_texture + 7),(long)(int)mf_2);
      pTVar7 = local_38;
      f_1 = (aiFace *)(long)*(short *)&out_2->mNormals;
      pmVar11 = std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&__range1,(key_type_conflict *)&f_1);
      ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
      local_7d0 = *ppaVar18;
      uVar9 = local_7d0->mNumFaces;
      local_7d0->mNumFaces = uVar9 + 1;
      vo_1 = (aiVector3D *)(local_7d0->mFaces + uVar9);
      uVar9 = *(uint *)((long)&out_2->mVertices + 4);
      ((aiFace *)vo_1)->mNumIndices = uVar9;
      pvVar19 = operator_new__((ulong)uVar9 << 2);
      *(void **)&vo_1->z = pvVar19;
      vn_1 = local_7d0->mVertices + local_7d0->mNumVertices;
      paStack_7f0 = local_7d0->mNormals + local_7d0->mNumVertices;
      for (loop._4_4_ = 0; loop._4_4_ < *(int *)((long)&out_2->mVertices + 4);
          loop._4_4_ = loop._4_4_ + 1) {
        local_800 = std::vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>::
                    operator[]((vector<Assimp::Blender::MLoop,_std::allocator<Assimp::Blender::MLoop>_>
                                *)&conv_data_local[3].materials_raw.
                                   super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node,
                               (long)(*(int *)&out_2->mVertices + loop._4_4_));
        if (*(int *)&conv_data_local[3].meshes.arr.
                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage <= local_800->v) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_820,"Vertex index out of range",
                     (allocator<char> *)((long)&v_1 + 7));
          LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_820);
          std::__cxx11::string::~string((string *)&local_820);
          std::allocator<char>::~allocator((allocator<char> *)((long)&v_1 + 7));
        }
        matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>::
                     operator[]((vector<Assimp::Blender::MVert,_std::allocator<Assimp::Blender::MVert>_>
                                 *)&conv_data_local[3].textures.arr.
                                    super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)local_800->v);
        vn_1->x = ((const_reference)
                  matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->co[0];
        vn_1->y = ((const_reference)
                  matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->co[1];
        vn_1->z = ((const_reference)
                  matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->co[2];
        paStack_7f0->x =
             ((const_reference)matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->
             no[0];
        paStack_7f0->y =
             ((const_reference)matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->
             no[1];
        paStack_7f0->z =
             ((const_reference)matTexUvMappings._M_t._M_impl.super__Rb_tree_header._M_node_count)->
             no[2];
        uVar9 = local_7d0->mNumVertices;
        local_7d0->mNumVertices = uVar9 + 1;
        *(uint *)(*(long *)&vo_1->z + (long)loop._4_4_ * 4) = uVar9;
        vn_1 = vn_1 + 1;
        paStack_7f0 = paStack_7f0 + 1;
      }
      if (*(int *)((long)&out_2->mVertices + 4) == 3) {
        local_7d0->mPrimitiveTypes = local_7d0->mPrimitiveTypes | 4;
      }
      else {
        local_7d0->mPrimitiveTypes = local_7d0->mPrimitiveTypes | 8;
      }
    }
    std::
    map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
    ::map((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
           *)&m);
    sVar10 = std::
             vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
             ::size((vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                     *)&conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._4_4_ = (uint)sVar10;
    for (pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._0_4_ = 0;
        (uint)pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi <
        pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_;
        pMat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = (uint)pMat.
                            super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1) {
      pvVar20 = std::
                vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ::operator[]((vector<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                              *)&conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,
                             (ulong)(uint)pMat.
                                          super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
      std::shared_ptr<Assimp::Blender::Material>::shared_ptr
                ((shared_ptr<Assimp::Blender::Material> *)
                 &texuv._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar20);
      std::
      map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
      ::map((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
             *)&t);
      pLoop._4_4_ = 0x12;
      for (pLoop._0_4_ = 0; (uint)pLoop < 0x12; pLoop._0_4_ = (uint)pLoop + 1) {
        peVar21 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&texuv._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar8 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)(peVar21->mtex + (uint)pLoop));
        if (bVar8) {
          peVar21 = std::
                    __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&texuv._M_t._M_impl.super__Rb_tree_header._M_node_count);
          peVar22 = std::
                    __shared_ptr_access<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(peVar21->mtex + (uint)pLoop));
          if (peVar22->uvname[0] != '\0') {
            pCVar6 = conv_data_local + 6;
            peVar21 = std::
                      __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&texuv._M_t._M_impl.super__Rb_tree_header._M_node_count);
            peVar22 = std::
                      __shared_ptr_access<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)(peVar21->mtex + (uint)pLoop));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8d8,peVar22->uvname,&local_8d9);
            pEVar23 = Blender::getCustomDataLayerData
                                ((CustomData *)(pCVar6->next_texture + 9),CD_MLOOPUV,&local_8d8);
            std::__cxx11::string::~string((string *)&local_8d8);
            std::allocator<char>::~allocator(&local_8d9);
            local_8b8 = pEVar23;
            if (pEVar23 != (ElemBase *)0x0) {
              if (pEVar23 == (ElemBase *)0x0) {
                local_db0 = (MLoopUV *)0x0;
              }
              else {
                local_db0 = (MLoopUV *)
                            __dynamic_cast(pEVar23,&Blender::ElemBase::typeinfo,
                                           &Blender::MLoopUV::typeinfo,0);
              }
              local_8f8 = local_db0;
              pVar35 = std::make_pair<unsigned_int&,Assimp::Blender::MLoopUV_const*>
                                 ((uint *)&pLoop,&local_8f8);
              local_8f0.second = pVar35.second;
              local_8f0.first = pVar35.first;
              _Var36 = std::
                       map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
                       ::insert<std::pair<unsigned_int,Assimp::Blender::MLoopUV_const*>>
                                 ((map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>
                                   *)&t,&local_8f0);
              local_908 = (_Base_ptr)_Var36.first._M_node;
              local_900 = _Var36.second;
            }
          }
        }
      }
      sVar24 = std::
               map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
               ::size((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                       *)&t);
      if (sVar24 != 0) {
        std::
        make_pair<unsigned_int&,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>&>
                  (&local_940,
                   (uint *)&pMat.
                            super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                   (map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                    *)&t);
        _Var37 = std::
                 map<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
                 ::
                 insert<std::pair<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>
                           ((map<unsigned_int,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::map<unsigned_int,Assimp::Blender::MLoopUV_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Assimp::Blender::MLoopUV_const*>>>>>>
                             *)&m,&local_940);
        local_950 = (_Base_ptr)_Var37.first._M_node;
        local_948 = _Var37.second;
        std::
        pair<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>
        ::~pair(&local_940);
      }
      std::
      map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
      ::~map((map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
              *)&t);
      std::shared_ptr<Assimp::Blender::Material>::~shared_ptr
                ((shared_ptr<Assimp::Blender::Material> *)
                 &texuv._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    bVar8 = Blender::vector::operator_cast_to_bool
                      ((vector *)
                       &conv_data_local[3].lights.arr.
                        super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if ((bVar8) ||
       (bVar8 = Blender::vector::operator_cast_to_bool
                          ((vector *)
                           &conv_data_local[3].materials_raw.
                            super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_last), bVar8)) {
      iVar1 = *(int *)&conv_data_local[3].meshes.arr.
                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      sVar10 = std::vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>::size
                         ((vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>
                           *)&conv_data_local[3].lights.arr.
                              super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      if ((int)sVar10 < iVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_970,
                   "Number of UV faces is larger than the corresponding UV face array (#1)",
                   (allocator<char> *)((long)&it_1._M_current + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_970);
        std::__cxx11::string::~string((string *)&local_970);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_current + 7));
      }
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      local_988._M_current =
           (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(pmVar12);
      local_980 = __gnu_cxx::
                  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                  operator+(&local_988,
                            mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
        itMatTexUvMapping._M_node =
             (_Base_ptr)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(pmVar12);
        bVar8 = __gnu_cxx::operator!=
                          (&local_980,
                           (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                            *)&itMatTexUvMapping);
        if (!bVar8) break;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_980);
        bVar8 = false;
        if ((*ppaVar29)->mNumVertices != 0) {
          ppaVar29 = __gnu_cxx::
                     __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                     ::operator*(&local_980);
          bVar8 = (*ppaVar29)->mNumFaces != 0;
        }
        if (!bVar8) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x423,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_980);
        local_998._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
             ::find((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                     *)&m,&(*ppaVar29)->mMaterialIndex);
        _i_5 = std::
               map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
               ::end((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                      *)&m);
        bVar8 = std::operator==(&local_998,(_Self *)&i_5);
        if (bVar8) {
          ppaVar29 = __gnu_cxx::
                     __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                     ::operator*(&local_980);
          uVar25 = (ulong)(*ppaVar29)->mNumVertices;
          paVar28 = (aiVector3D *)operator_new__(uVar25 * 0xc);
          if (uVar25 != 0) {
            local_e20 = paVar28;
            do {
              aiVector3t<float>::aiVector3t(local_e20);
              local_e20 = local_e20 + 1;
            } while (local_e20 != paVar28 + uVar25);
          }
          ppaVar29 = __gnu_cxx::
                     __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                     ::operator*(&local_980);
          (*ppaVar29)->mTextureCoords[0] = paVar28;
        }
        else {
          v_2._4_4_ = 0;
          while( true ) {
            uVar25 = (ulong)v_2._4_4_;
            ppVar26 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>
                      ::operator->(&local_998);
            sVar24 = std::
                     map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                     ::size(&ppVar26->second);
            if (sVar24 <= uVar25) break;
            ppaVar29 = __gnu_cxx::
                       __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                       ::operator*(&local_980);
            uVar25 = (ulong)(*ppaVar29)->mNumVertices;
            paVar28 = (aiVector3D *)operator_new__(uVar25 * 0xc);
            if (uVar25 != 0) {
              local_e50 = paVar28;
              do {
                aiVector3t<float>::aiVector3t(local_e50);
                local_e50 = local_e50 + 1;
              } while (local_e50 != paVar28 + uVar25);
            }
            ppaVar29 = __gnu_cxx::
                       __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                       ::operator*(&local_980);
            (*ppaVar29)->mTextureCoords[v_2._4_4_] = paVar28;
            v_2._4_4_ = v_2._4_4_ + 1;
          }
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_980);
        (*ppaVar29)->mNumVertices = 0;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_980);
        (*ppaVar29)->mNumFaces = 0;
        __gnu_cxx::__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++(&local_980);
      }
      for (v_2._0_4_ = 0;
          (int)v_2 <
          *(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish; v_2._0_4_ = (int)v_2 + 1) {
        out_3 = (aiMesh *)
                std::vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>::
                operator[]((vector<Assimp::Blender::MTFace,_std::allocator<Assimp::Blender::MTFace>_>
                            *)&conv_data_local[3].lights.arr.
                               super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)(int)v_2);
        pTVar7 = local_38;
        pvVar31 = std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::
                  operator[]((vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                              *)&conv_data_local[3].cameras.arr.
                                 super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,(long)(int)v_2);
        f_2 = (aiFace *)(long)pvVar31->mat_nr;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&__range1,(key_type_conflict *)&f_2);
        ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
        local_9b8 = *ppaVar18;
        uVar9 = local_9b8->mNumFaces;
        local_9b8->mNumFaces = uVar9 + 1;
        vo_2 = (aiVector3D *)(local_9b8->mFaces + uVar9);
        _i_7 = local_9b8->mTextureCoords[0] + local_9b8->mNumVertices;
        v_3._4_4_ = 0;
        while (v_3._4_4_ < ((aiFace *)vo_2)->mNumIndices) {
          _i_7->x = *(float *)(out_3->mColors + ((ulong)v_3._4_4_ - 4));
          _i_7->y = *(float *)((long)out_3->mColors + (ulong)v_3._4_4_ * 8 + -0x1c);
          v_3._4_4_ = v_3._4_4_ + 1;
          _i_7 = _i_7 + 1;
          local_9b8->mNumVertices = local_9b8->mNumVertices + 1;
        }
      }
      for (v_3._0_4_ = 0;
          (int)v_3 <
          *(int *)&conv_data_local[3].cameras.arr.
                   super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                   super__Vector_impl_data._M_start; v_3._0_4_ = (int)v_3 + 1) {
        out_4 = (aiMesh *)
                std::vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>::
                operator[]((vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                            *)(conv_data_local[3].next_texture + 7),(long)(int)v_3);
        pTVar7 = local_38;
        f_3 = (aiFace *)(long)*(short *)&out_4->mNormals;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&__range1,(key_type_conflict *)&f_3);
        ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
        local_9e8 = *ppaVar18;
        uVar9 = local_9e8->mNumFaces;
        local_9e8->mNumFaces = uVar9 + 1;
        itMatTexUvMapping_1._M_node = (_Base_ptr)(local_9e8->mFaces + uVar9);
        local_a04 = (key_type)*(short *)&out_4->mNormals;
        local_a00._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
             ::find((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                     *)&m,&local_a04);
        vo_3 = (aiVector3D *)
               std::
               map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
               ::end((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
                      *)&m);
        bVar8 = std::operator==(&local_a00,(_Self *)&vo_3);
        if (bVar8) {
          paStack_a18 = local_9e8->mTextureCoords[0] + local_9e8->mNumVertices;
          uv._4_4_ = _S_red;
          while (uv._4_4_ < (itMatTexUvMapping_1._M_node)->_M_color) {
            pvStack_a28 = std::
                          vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                          ::operator[]((vector<Assimp::Blender::MLoopUV,_std::allocator<Assimp::Blender::MLoopUV>_>
                                        *)&conv_data_local[3].materials_raw.
                                           super__Deque_base<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                                           ._M_impl.super__Deque_impl_data._M_finish._M_last,
                                       (ulong)(*(int *)&out_4->mVertices + uv._4_4_));
            paStack_a18->x = pvStack_a28->uv[0];
            paStack_a18->y = pvStack_a28->uv[1];
            uv._4_4_ = uv._4_4_ + _S_black;
            paStack_a18 = paStack_a18 + 1;
            local_9e8->mNumVertices = local_9e8->mNumVertices + 1;
          }
        }
        else {
          tm._4_4_ = 0;
          while( true ) {
            uVar25 = (ulong)tm._4_4_;
            ppVar26 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>
                      ::operator->(&local_a00);
            sVar24 = std::
                     map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                     ::size(&ppVar26->second);
            if (sVar24 <= uVar25) break;
            ppVar26 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>
                      ::operator->(&local_a00);
            ppMVar27 = std::
                       map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                       ::operator[](&ppVar26->second,(key_type *)((long)&tm + 4));
            vo_4 = (aiVector3D *)*ppMVar27;
            paStack_a40 = local_9e8->mTextureCoords[tm._4_4_] + local_9e8->mNumVertices;
            for (uv_1._4_4_ = _S_red; uv_1._4_4_ < (itMatTexUvMapping_1._M_node)->_M_color;
                uv_1._4_4_ = uv_1._4_4_ + _S_black) {
              local_a50 = (mapped_type)
                          ((long)vo_4 + (ulong)(*(int *)&out_4->mVertices + uv_1._4_4_) * 0x20);
              paStack_a40->x = local_a50->uv[0];
              paStack_a40->y = local_a50->uv[1];
              paStack_a40 = paStack_a40 + 1;
            }
            uVar25 = (ulong)tm._4_4_;
            ppVar26 = std::
                      _Rb_tree_iterator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>
                      ::operator->(&local_a00);
            sVar24 = std::
                     map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>
                     ::size(&ppVar26->second);
            if (uVar25 == sVar24 - 1) {
              local_9e8->mNumVertices = uv_1._4_4_ + local_9e8->mNumVertices;
            }
            tm._4_4_ = tm._4_4_ + 1;
          }
        }
      }
    }
    bVar8 = Blender::vector::operator_cast_to_bool
                      ((vector *)
                       &conv_data_local[3].materials.arr.
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar8) {
      iVar1 = *(int *)&conv_data_local[3].meshes.arr.
                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      sVar10 = std::vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>::size
                         ((vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_> *
                          )&conv_data_local[3].materials.arr.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
      if ((int)sVar10 < iVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a70,
                   "Number of faces is larger than the corresponding UV face array (#2)",
                   (allocator<char> *)((long)&it_2._M_current + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_2._M_current + 7));
      }
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      local_a88._M_current =
           (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(pmVar12);
      local_a80 = __gnu_cxx::
                  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                  operator+(&local_a88,
                            mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
        iStack_a90 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(pmVar12);
        bVar8 = __gnu_cxx::operator!=(&local_a80,&stack0xfffffffffffff570);
        if (!bVar8) break;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_a80);
        bVar8 = false;
        if ((*ppaVar29)->mNumVertices != 0) {
          ppaVar29 = __gnu_cxx::
                     __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                     ::operator*(&local_a80);
          bVar8 = (*ppaVar29)->mNumFaces != 0;
        }
        if (!bVar8) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x469,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_a80);
        uVar25 = (ulong)(*ppaVar29)->mNumVertices;
        paVar28 = (aiVector3D *)operator_new__(uVar25 * 0xc);
        if (uVar25 != 0) {
          local_ef0 = paVar28;
          do {
            aiVector3t<float>::aiVector3t(local_ef0);
            local_ef0 = local_ef0 + 1;
          } while (local_ef0 != paVar28 + uVar25);
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_a80);
        (*ppaVar29)->mTextureCoords[0] = paVar28;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_a80);
        (*ppaVar29)->mNumVertices = 0;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_a80);
        (*ppaVar29)->mNumFaces = 0;
        __gnu_cxx::__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++(&local_a80);
      }
      for (v_4._4_4_ = 0;
          v_4._4_4_ <
          *(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish; v_4._4_4_ = v_4._4_4_ + 1) {
        out_5 = (aiMesh *)
                std::vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>::
                operator[]((vector<Assimp::Blender::TFace,_std::allocator<Assimp::Blender::TFace>_>
                            *)&conv_data_local[3].materials.arr.
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)v_4._4_4_);
        pTVar7 = local_38;
        pvVar31 = std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::
                  operator[]((vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                              *)&conv_data_local[3].cameras.arr.
                                 super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,(long)v_4._4_4_);
        f_4 = (aiFace *)(long)pvVar31->mat_nr;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&__range1,(key_type_conflict *)&f_4);
        ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
        local_aa8 = *ppaVar18;
        uVar9 = local_aa8->mNumFaces;
        local_aa8->mNumFaces = uVar9 + 1;
        vo_5 = (aiVector3D *)(local_aa8->mFaces + uVar9);
        paStack_ac0 = local_aa8->mTextureCoords[0] + local_aa8->mNumVertices;
        local_ac4 = 0;
        while (local_ac4 < ((aiFace *)vo_5)->mNumIndices) {
          paStack_ac0->x = *(float *)(out_5->mColors + ((ulong)local_ac4 - 4));
          paStack_ac0->y = *(float *)((long)out_5->mColors + (ulong)local_ac4 * 8 + -0x1c);
          local_ac4 = local_ac4 + 1;
          paStack_ac0 = paStack_ac0 + 1;
          local_aa8->mNumVertices = local_aa8->mNumVertices + 1;
        }
      }
    }
    bVar8 = Blender::vector::operator_cast_to_bool
                      ((vector *)
                       &conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent);
    if ((bVar8) ||
       (bVar8 = Blender::vector::operator_cast_to_bool
                          ((vector *)(conv_data_local[3].next_texture + 1)), bVar8)) {
      iVar1 = *(int *)&conv_data_local[3].meshes.arr.
                       super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      sVar10 = std::vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>::size
                         ((vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_> *)
                          &conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent);
      if ((int)(sVar10 >> 2) < iVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ae8,
                   "Number of faces is larger than the corresponding color face array",
                   (allocator<char> *)((long)&it_3._M_current + 7));
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_ae8);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&it_3._M_current + 7));
      }
      pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
      local_b00._M_current =
           (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(pmVar12);
      local_af8 = __gnu_cxx::
                  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                  operator+(&local_b00,
                            mat_num_to_mesh_idx._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        pmVar12 = Blender::TempArray<std::vector,_aiMesh>::operator->(local_38);
        iStack_b08 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(pmVar12);
        bVar8 = __gnu_cxx::operator!=(&local_af8,&stack0xfffffffffffff4f8);
        if (!bVar8) break;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_af8);
        bVar8 = false;
        if ((*ppaVar29)->mNumVertices != 0) {
          ppaVar29 = __gnu_cxx::
                     __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                     ::operator*(&local_af8);
          bVar8 = (*ppaVar29)->mNumFaces != 0;
        }
        if (!bVar8) {
          __assert_fail("(*it)->mNumVertices && (*it)->mNumFaces",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderLoader.cpp"
                        ,0x483,
                        "void Assimp::BlenderImporter::ConvertMesh(const Scene &, const Object *, const Mesh *, ConversionData &, TempArray<vector, aiMesh> &)"
                       );
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_af8);
        uVar25 = (ulong)(*ppaVar29)->mNumVertices;
        paVar30 = (aiColor4D *)operator_new__(uVar25 << 4);
        if (uVar25 != 0) {
          local_f58 = paVar30;
          do {
            aiColor4t<float>::aiColor4t(local_f58);
            local_f58 = local_f58 + 1;
          } while (local_f58 != paVar30 + uVar25);
        }
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_af8);
        (*ppaVar29)->mColors[0] = paVar30;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_af8);
        (*ppaVar29)->mNumVertices = 0;
        ppaVar29 = __gnu_cxx::
                   __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
                   operator*(&local_af8);
        (*ppaVar29)->mNumFaces = 0;
        __gnu_cxx::__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++(&local_af8);
      }
      for (out_6._4_4_ = 0; pTVar7 = local_38,
          out_6._4_4_ <
          *(int *)&conv_data_local[3].meshes.arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish; out_6._4_4_ = out_6._4_4_ + 1) {
        pvVar31 = std::vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>::
                  operator[]((vector<Assimp::Blender::MFace,_std::allocator<Assimp::Blender::MFace>_>
                              *)&conv_data_local[3].cameras.arr.
                                 super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,(long)out_6._4_4_);
        f_5 = (aiFace *)(long)pvVar31->mat_nr;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&__range1,(key_type_conflict *)&f_5);
        ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
        local_b18 = *ppaVar18;
        uVar9 = local_b18->mNumFaces;
        local_b18->mNumFaces = uVar9 + 1;
        vo_6 = (aiColor4D *)(local_b18->mFaces + uVar9);
        paStack_b30 = local_b18->mColors[0] + local_b18->mNumVertices;
        col._4_4_ = 0.0;
        while ((uint)col._4_4_ < (uint)vo_6->r) {
          _i_11 = std::vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>::
                  operator[]((vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>
                              *)&conv_data_local[4].objects._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_parent,(ulong)(uint)((int)col._4_4_ + out_6._4_4_ * 4)
                            );
          paStack_b30->r = (float)(int)_i_11->r;
          paStack_b30->g = (float)(int)_i_11->g;
          paStack_b30->b = (float)(int)_i_11->b;
          paStack_b30->a = (float)(int)_i_11->a;
          col._4_4_ = (float)((int)col._4_4_ + 1);
          paStack_b30 = paStack_b30 + 1;
          local_b18->mNumVertices = local_b18->mNumVertices + 1;
        }
        for (v_5._4_4_ = vo_6->r; (uint)v_5._4_4_ < 4; v_5._4_4_ = (float)((int)v_5._4_4_ + 1)) {
        }
      }
      for (v_5._0_4_ = 0;
          (int)v_5 <
          *(int *)&conv_data_local[3].cameras.arr.
                   super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                   super__Vector_impl_data._M_start; v_5._0_4_ = (int)v_5 + 1) {
        out_7 = (aiMesh *)
                std::vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>::
                operator[]((vector<Assimp::Blender::MPoly,_std::allocator<Assimp::Blender::MPoly>_>
                            *)(conv_data_local[3].next_texture + 7),(long)(int)v_5);
        pTVar7 = local_38;
        f_6 = (aiFace *)(long)*(short *)&out_7->mNormals;
        pmVar11 = std::
                  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                *)&__range1,(key_type_conflict *)&f_6);
        ppaVar18 = Blender::TempArray<std::vector,_aiMesh>::operator[](pTVar7,*pmVar11);
        local_b58 = *ppaVar18;
        paVar33 = local_b58->mFaces;
        uVar9 = local_b58->mNumFaces;
        local_b58->mNumFaces = uVar9 + 1;
        _j_3 = local_b58->mColors[0] + local_b58->mNumVertices;
        col_1._0_4_ = 0;
        while ((uint)col_1 < paVar33[uVar9].mNumIndices) {
          pvVar32 = std::
                    vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>::
                    operator[]((vector<Assimp::Blender::MLoopCol,_std::allocator<Assimp::Blender::MLoopCol>_>
                                *)(conv_data_local[3].next_texture + 1),
                               (ulong)(*(int *)&out_7->mVertices + (uint)col_1));
          _j_3->r = (float)pvVar32->r * 0.003921569;
          _j_3->g = (float)pvVar32->g * 0.003921569;
          _j_3->b = (float)pvVar32->b * 0.003921569;
          _j_3->a = (float)pvVar32->a * 0.003921569;
          col_1._0_4_ = (uint)col_1 + 1;
          _j_3 = _j_3 + 1;
          local_b58->mNumVertices = local_b58->mNumVertices + 1;
        }
      }
    }
    std::
    map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
    ::~map((map<unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_const_Assimp::Blender::MLoopUV_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_Assimp::Blender::MLoopUV_*>_>_>_>_>_>
            *)&m);
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)&__range1);
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    ~map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
          *)local_120);
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    ~map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
          *)&per_mat_verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return;
}

Assistant:

void BlenderImporter::ConvertMesh(const Scene& /*in*/, const Object* /*obj*/, const Mesh* mesh,
    ConversionData& conv_data, TempArray<std::vector,aiMesh>&  temp
    )
{
    // TODO: Resolve various problems with BMesh triangulation before re-enabling.
    //       See issues #400, #373, #318  #315 and #132.
#if defined(TODO_FIX_BMESH_CONVERSION)
    BlenderBMeshConverter BMeshConverter( mesh );
    if ( BMeshConverter.ContainsBMesh( ) )
    {
        mesh = BMeshConverter.TriangulateBMesh( );
    }
#endif

    typedef std::pair<const int,size_t> MyPair;
    if ((!mesh->totface && !mesh->totloop) || !mesh->totvert) {
        return;
    }

    // some sanity checks
    if (static_cast<size_t> ( mesh->totface ) > mesh->mface.size() ){
        ThrowException("Number of faces is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totvert ) > mesh->mvert.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    if (static_cast<size_t> ( mesh->totloop ) > mesh->mloop.size()) {
        ThrowException("Number of vertices is larger than the corresponding array");
    }

    // collect per-submesh numbers
    std::map<int,size_t> per_mat;
    std::map<int,size_t> per_mat_verts;
    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];
        per_mat[ mf.mat_nr ]++;
        per_mat_verts[ mf.mat_nr ] += mf.v4?4:3;
    }

    for (int i = 0; i < mesh->totpoly; ++i) {
        const MPoly& mp = mesh->mpoly[i];
        per_mat[ mp.mat_nr ]++;
        per_mat_verts[ mp.mat_nr ] += mp.totloop;
    }

    // ... and allocate the corresponding meshes
    const size_t old = temp->size();
    temp->reserve(temp->size() + per_mat.size());

    std::map<size_t,size_t> mat_num_to_mesh_idx;
    for(MyPair& it : per_mat) {

        mat_num_to_mesh_idx[it.first] = temp->size();
        temp->push_back(new aiMesh());

        aiMesh* out = temp->back();
        out->mVertices = new aiVector3D[per_mat_verts[it.first]];
        out->mNormals  = new aiVector3D[per_mat_verts[it.first]];

        //out->mNumFaces = 0
        //out->mNumVertices = 0
        out->mFaces = new aiFace[it.second]();

        // all sub-meshes created from this mesh are named equally. this allows
        // curious users to recover the original adjacency.
        out->mName = aiString(mesh->id.name+2);
            // skip over the name prefix 'ME'

        // resolve the material reference and add this material to the set of
        // output materials. The (temporary) material index is the index
        // of the material entry within the list of resolved materials.
        if (mesh->mat) {

            if (static_cast<size_t> ( it.first ) >= mesh->mat.size() ) {
                ThrowException("Material index is out of range");
            }

            std::shared_ptr<Material> mat = mesh->mat[it.first];
            const std::deque< std::shared_ptr<Material> >::iterator has = std::find(
                    conv_data.materials_raw.begin(),
                    conv_data.materials_raw.end(),mat
            );

            if (has != conv_data.materials_raw.end()) {
                out->mMaterialIndex = static_cast<unsigned int>( std::distance(conv_data.materials_raw.begin(),has));
            }
            else {
                out->mMaterialIndex = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(mat);
            }
        }
        else out->mMaterialIndex = static_cast<unsigned int>( -1 );
    }

    for (int i = 0; i < mesh->totface; ++i) {

        const MFace& mf = mesh->mface[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.v4?4:3 ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.

        if (mf.v1 >= mesh->totvert) {
            ThrowException("Vertex index v1 out of range");
        }
        const MVert* v = &mesh->mvert[mf.v1];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[0] = out->mNumVertices++;
        ++vo;
        ++vn;

        //  if (f.mNumIndices >= 2) {
        if (mf.v2 >= mesh->totvert) {
            ThrowException("Vertex index v2 out of range");
        }
        v = &mesh->mvert[mf.v2];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[1] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v3 >= mesh->totvert) {
            ThrowException("Vertex index v3 out of range");
        }
        //  if (f.mNumIndices >= 3) {
        v = &mesh->mvert[mf.v3];
        vo->x = v->co[0];
        vo->y = v->co[1];
        vo->z = v->co[2];
        vn->x = v->no[0];
        vn->y = v->no[1];
        vn->z = v->no[2];
        f.mIndices[2] = out->mNumVertices++;
        ++vo;
        ++vn;

        if (mf.v4 >= mesh->totvert) {
            ThrowException("Vertex index v4 out of range");
        }
        //  if (f.mNumIndices >= 4) {
        if (mf.v4) {
            v = &mesh->mvert[mf.v4];
            vo->x = v->co[0];
            vo->y = v->co[1];
            vo->z = v->co[2];
            vn->x = v->no[0];
            vn->y = v->no[1];
            vn->z = v->no[2];
            f.mIndices[3] = out->mNumVertices++;
            ++vo;
            ++vn;

            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
        else out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;

        //  }
        //  }
        //  }
    }

    for (int i = 0; i < mesh->totpoly; ++i) {

        const MPoly& mf = mesh->mpoly[i];

        aiMesh* const out = temp[ mat_num_to_mesh_idx[ mf.mat_nr ] ];
        aiFace& f = out->mFaces[out->mNumFaces++];

        f.mIndices = new unsigned int[ f.mNumIndices = mf.totloop ];
        aiVector3D* vo = out->mVertices + out->mNumVertices;
        aiVector3D* vn = out->mNormals + out->mNumVertices;

        // XXX we can't fold this easily, because we are restricted
        // to the member names from the BLEND file (v1,v2,v3,v4)
        // which are assigned by the genblenddna.py script and
        // cannot be changed without breaking the entire
        // import process.
        for (int j = 0;j < mf.totloop; ++j)
        {
            const MLoop& loop = mesh->mloop[mf.loopstart + j];

            if (loop.v >= mesh->totvert) {
                ThrowException("Vertex index out of range");
            }

            const MVert& v = mesh->mvert[loop.v];

            vo->x = v.co[0];
            vo->y = v.co[1];
            vo->z = v.co[2];
            vn->x = v.no[0];
            vn->y = v.no[1];
            vn->z = v.no[2];
            f.mIndices[j] = out->mNumVertices++;

            ++vo;
            ++vn;

        }
        if (mf.totloop == 3)
        {
            out->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
        }
        else
        {
            out->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
        }
    }

    // TODO should we create the TextureUVMapping map in Convert<Material> to prevent redundant processing?

    // create texture <-> uvname mapping for all materials
    // key is texture number, value is data *
    typedef std::map<uint32_t, const MLoopUV *> TextureUVMapping;
    // key is material number, value is the TextureUVMapping for the material
    typedef std::map<uint32_t, TextureUVMapping> MaterialTextureUVMappings;
    MaterialTextureUVMappings matTexUvMappings;
    const uint32_t maxMat = static_cast<const uint32_t>(mesh->mat.size());
    for (uint32_t m = 0; m < maxMat; ++m) {
        // get material by index
        const std::shared_ptr<Material> pMat = mesh->mat[m];
        TextureUVMapping texuv;
        const uint32_t maxTex = sizeof(pMat->mtex) / sizeof(pMat->mtex[0]);
        for (uint32_t t = 0; t < maxTex; ++t) {
            if (pMat->mtex[t] && pMat->mtex[t]->uvname[0]) {
                // get the CustomData layer for given uvname and correct type
                const ElemBase *pLoop = getCustomDataLayerData(mesh->ldata, CD_MLOOPUV, pMat->mtex[t]->uvname);
                if (pLoop) {
                    texuv.insert(std::make_pair(t, dynamic_cast<const MLoopUV *>(pLoop)));
                }
            }
        }
        if (texuv.size()) {
            matTexUvMappings.insert(std::make_pair(m, texuv));
        }
    }

    // collect texture coordinates, they're stored in a separate per-face buffer
    if (mesh->mtface || mesh->mloopuv) {
        if (mesh->totface > static_cast<int> ( mesh->mtface.size())) {
            ThrowException("Number of UV faces is larger than the corresponding UV face array (#1)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);
            const auto itMatTexUvMapping = matTexUvMappings.find((*it)->mMaterialIndex);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // default behaviour like before
                (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            }
            else {
                // create texture coords for every mapped tex
                for (uint32_t i = 0; i < itMatTexUvMapping->second.size(); ++i) {
                    (*it)->mTextureCoords[i] = new aiVector3D[(*it)->mNumVertices];
                }
            }
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const MTFace* v = &mesh->mtface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            const auto itMatTexUvMapping = matTexUvMappings.find(v.mat_nr);
            if (itMatTexUvMapping == matTexUvMappings.end()) {
                // old behavior
                aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
                for (unsigned int j = 0; j < f.mNumIndices; ++j, ++vo, ++out->mNumVertices) {
                    const MLoopUV& uv = mesh->mloopuv[v.loopstart + j];
                    vo->x = uv.uv[0];
                    vo->y = uv.uv[1];
                }
            }
            else {
                // create textureCoords for every mapped tex
                for (uint32_t m = 0; m < itMatTexUvMapping->second.size(); ++m) {
                    const MLoopUV *tm = itMatTexUvMapping->second[m];
                    aiVector3D* vo = &out->mTextureCoords[m][out->mNumVertices];
                    uint32_t j = 0;
                    for (; j < f.mNumIndices; ++j, ++vo) {
                        const MLoopUV& uv = tm[v.loopstart + j];
                        vo->x = uv.uv[0];
                        vo->y = uv.uv[1];
                    }
                    // only update written mNumVertices in last loop
                    // TODO why must the numVertices be incremented here?
                    if (m == itMatTexUvMapping->second.size() - 1) {
                        out->mNumVertices += j;
                    }
                }
            }
        }
    }

    // collect texture coordinates, old-style (marked as deprecated in current blender sources)
    if (mesh->tface) {
        if (mesh->totface > static_cast<int> ( mesh->tface.size())) {
            ThrowException("Number of faces is larger than the corresponding UV face array (#2)");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mTextureCoords[0] = new aiVector3D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {
            const TFace* v = &mesh->tface[i];

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiVector3D* vo = &out->mTextureCoords[0][out->mNumVertices];
            for (unsigned int i = 0; i < f.mNumIndices; ++i,++vo,++out->mNumVertices) {
                vo->x = v->uv[i][0];
                vo->y = v->uv[i][1];
            }
        }
    }

    // collect vertex colors, stored separately as well
    if (mesh->mcol || mesh->mloopcol) {
        if (mesh->totface > static_cast<int> ( (mesh->mcol.size()/4)) ) {
            ThrowException("Number of faces is larger than the corresponding color face array");
        }
        for (std::vector<aiMesh*>::iterator it = temp->begin()+old; it != temp->end(); ++it) {
            ai_assert((*it)->mNumVertices && (*it)->mNumFaces);

            (*it)->mColors[0] = new aiColor4D[(*it)->mNumVertices];
            (*it)->mNumFaces = (*it)->mNumVertices = 0;
        }

        for (int i = 0; i < mesh->totface; ++i) {

            aiMesh* const out = temp[ mat_num_to_mesh_idx[ mesh->mface[i].mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
            for (unsigned int n = 0; n < f.mNumIndices; ++n, ++vo,++out->mNumVertices) {
                const MCol* col = &mesh->mcol[(i<<2)+n];

                vo->r = col->r;
                vo->g = col->g;
                vo->b = col->b;
                vo->a = col->a;
            }
            for (unsigned int n = f.mNumIndices; n < 4; ++n);
        }

        for (int i = 0; i < mesh->totpoly; ++i) {
            const MPoly& v = mesh->mpoly[i];
            aiMesh* const out = temp[ mat_num_to_mesh_idx[ v.mat_nr ] ];
            const aiFace& f = out->mFaces[out->mNumFaces++];

            aiColor4D* vo = &out->mColors[0][out->mNumVertices];
			const ai_real scaleZeroToOne = 1.f/255.f;
            for (unsigned int j = 0; j < f.mNumIndices; ++j,++vo,++out->mNumVertices) {
                const MLoopCol& col = mesh->mloopcol[v.loopstart + j];
                vo->r = ai_real(col.r) * scaleZeroToOne;
                vo->g = ai_real(col.g) * scaleZeroToOne;
                vo->b = ai_real(col.b) * scaleZeroToOne;
                vo->a = ai_real(col.a) * scaleZeroToOne;
            }

        }

    }

    return;
}